

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.cpp
# Opt level: O1

void UpdateUVIndex(list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *l,uint n)

{
  _List_node_base *p_Var1;
  uint local_24;
  
  p_Var1 = (l->super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)l) {
    local_24 = n;
    do {
      if (p_Var1[1]._M_next == (_List_node_base *)0x0) {
        if (local_24 == 0) {
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)p_Var1[1]._M_prev,&local_24,4,"$tex.uvwsrc",
                     *(uint *)&p_Var1[2]._M_next,*(uint *)((long)&p_Var1[2]._M_next + 4),
                     aiPTI_Integer);
        }
      }
      else {
        *(uint *)&(p_Var1[1]._M_next)->_M_next = local_24;
      }
      p_Var1 = (((_List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var1 != (_List_node_base *)l);
  }
  return;
}

Assistant:

void UpdateUVIndex(const std::list<TTUpdateInfo>& l, unsigned int n)
{
    // Don't set if == 0 && wasn't set before
    for (std::list<TTUpdateInfo>::const_iterator it = l.begin();it != l.end(); ++it) {
        const TTUpdateInfo& info = *it;

        if (info.directShortcut)
            *info.directShortcut = n;
        else if (!n)
        {
            info.mat->AddProperty<int>((int*)&n,1,AI_MATKEY_UVWSRC(info.semantic,info.index));
        }
    }
}